

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

int64_t __thiscall wallet::CWallet::IncOrderPosNext(CWallet *this,WalletBatch *batch)

{
  long nOrderPosNext;
  long lVar1;
  WalletDatabase *pWVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  WalletBatch local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->nOrderPosNext;
  nOrderPosNext = lVar1 + 1;
  this->nOrderPosNext = nOrderPosNext;
  if (batch == (WalletBatch *)0x0) {
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar2 == (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    (*pWVar2->_vptr_WalletDatabase[0xe])(&local_38,pWVar2,1);
    local_38.m_database = pWVar2;
    WalletBatch::WriteOrderPosNext(&local_38,this->nOrderPosNext);
    if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
        local_38.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl != (DatabaseBatch *)0x0)
    {
      (**(code **)(*(long *)local_38.m_batch._M_t.
                            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl +
                  0x28))();
    }
  }
  else {
    WalletBatch::WriteOrderPosNext(batch,nOrderPosNext);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return lVar1;
  }
  __stack_chk_fail();
}

Assistant:

int64_t CWallet::IncOrderPosNext(WalletBatch* batch)
{
    AssertLockHeld(cs_wallet);
    int64_t nRet = nOrderPosNext++;
    if (batch) {
        batch->WriteOrderPosNext(nOrderPosNext);
    } else {
        WalletBatch(GetDatabase()).WriteOrderPosNext(nOrderPosNext);
    }
    return nRet;
}